

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median-sorted.cpp
# Opt level: O1

double findMedianSortedArrays
                 (vector<int,_std::allocator<int>_> *A,vector<int,_std::allocator<int>_> *B)

{
  pointer piVar1;
  pointer piVar2;
  ostream *poVar3;
  long *plVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  char local_39;
  vector<int,_std::allocator<int>_> *local_38;
  
  piVar1 = (A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar11 = (long)(B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                 _M_finish - (long)piVar2;
  iVar10 = (int)(uVar11 >> 2);
  iVar9 = (int)((ulong)((long)(A->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
  iVar5 = ((int)(((uint)(uVar11 >> 0x21) & 1) + iVar10) >> 1) + iVar9 + -1;
  if (iVar5 < 1) {
    lVar12 = -1;
    lVar6 = -1;
  }
  else {
    iVar7 = 0;
    iVar8 = 0;
    do {
      if (piVar1[iVar8] < piVar2[iVar7]) {
        if (iVar8 < iVar9 + -1) {
          iVar8 = iVar8 + 1;
        }
        else {
          iVar7 = iVar7 + 1;
        }
      }
      if (piVar2[iVar7] <= piVar1[iVar8]) {
        if (iVar7 < iVar10 + -1) {
          iVar7 = iVar7 + 1;
        }
        else {
          iVar8 = iVar8 + 1;
        }
      }
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    lVar12 = (long)(iVar8 + -1);
    lVar6 = (long)(iVar7 + -1);
  }
  local_38 = A;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,piVar1[lVar12]);
  local_39 = ' ';
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_39,1);
  plVar4 = (long *)std::ostream::operator<<
                             (poVar3,(B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                     super__Vector_impl_data._M_start[lVar6]);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  iVar5 = (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[lVar12];
  if ((iVar10 + iVar9 & 0x80000001U) == 1) {
    iVar9 = (B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start[lVar6];
    if (iVar5 < iVar9) {
      dVar13 = (double)iVar5;
    }
    else {
      dVar13 = (double)iVar9;
    }
  }
  else {
    dVar13 = ((double)(B->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar6] + (double)iVar5) * 0.5;
  }
  return dVar13;
}

Assistant:

double findMedianSortedArrays(const vector<int> &A, const vector<int> &B) {

  int lA = A.size();
  int lB = B.size();
  int medPos = (lA + lB / 2) - 1;
  int a = 0, b = 0 , c = 0;
  while (c < medPos) {
    if (A[a] < B[b]) {
      if (a < lA - 1) a++;
      else b++;
    }
    if (A[a] >= B[b]) {
      if (b < lB - 1) b++;
      else a++;
    }
    c++;
  }
  cout<<A[a-1]<<' '<<B[b-1]<<endl;

  if ((lA + lB) % 2 == 1) {
    if (A[a-1] < B[b-1]) return A[a-1];
    else return B[b-1];
  } else {
    return (((double)A[a-1]) + ((double)B[b-1])) / 2;
  }
}